

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O1

TestFuncExecutorBase * trun::TestFuncExecutorFactory::Create(Ref *library)

{
  Config *pCVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  element_type *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  if (Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor == '\0') {
    Create();
  }
  pCVar1 = Config::Instance();
  if (pCVar1->testExecutionType == kSequential) {
    Create::sequentialExecutor.super_TestFuncExecutorBase.library.
    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_10._M_pi =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_10._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_10._M_pi)->_M_use_count = (local_10._M_pi)->_M_use_count + 1;
      }
    }
    local_18 = Create::sequentialExecutor.super_TestFuncExecutorBase.library.
               super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::sequentialExecutor.super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_10);
    this._M_pi = local_10._M_pi;
  }
  else {
    puts("Unknown or unsupported test execution model, using default");
    Create::sequentialExecutor.super_TestFuncExecutorBase.library.
    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_20._M_pi =
         (library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::sequentialExecutor.super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_20);
    this._M_pi = local_20._M_pi;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  return &Create::sequentialExecutor.super_TestFuncExecutorBase;
}

Assistant:

TestFuncExecutorBase &TestFuncExecutorFactory::Create(IDynLibrary::Ref library) {
    static TestFuncExecutorSequential sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
    static TestFuncExecutorParallel parallelExecutor;
    static TestFuncExecutorParallelPThread parallelExecutorPThread;
#endif

    switch(Config::Instance().testExecutionType) {
        case TestExecutiontype::kSequential :
            // In case we are a sub-process, we run in threads anyway  <- should we?
#ifdef TRUN_HAVE_THREADS
            if (Config::Instance().isSubProcess) {
                parallelExecutor.SetLibrary(library);
                return parallelExecutor;
            }
#endif
            sequentialExecutor.SetLibrary(library);
            return sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
        case TestExecutiontype::kThreaded :
            parallelExecutor.SetLibrary(library);
            return parallelExecutor;
        case TestExecutiontype::kThreadedWithExit :
            parallelExecutorPThread.SetLibrary(library);
            return parallelExecutorPThread;
#endif
        default:
            printf("Unknown or unsupported test execution model, using default\n");
            break;
    }
    // Always available
    sequentialExecutor.SetLibrary(library);
    return sequentialExecutor;
}